

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

void get_range<float,int>
               (size_t col_num,size_t nrows,float *Xc,int *Xc_ind,int *Xc_indptr,
               MissingAction missing_action,double *xmin,double *xmax,bool *unsplittable)

{
  int iVar1;
  int iVar2;
  double dVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  double dVar12;
  ulong uVar13;
  
  *xmin = INFINITY;
  *xmax = -INFINITY;
  iVar1 = Xc_indptr[col_num + 1];
  lVar6 = (long)iVar1;
  iVar2 = Xc_indptr[col_num];
  lVar5 = (long)iVar2;
  if ((ulong)(lVar6 - lVar5) < nrows) {
    *xmin = 0.0;
    *xmax = 0.0;
  }
  if (missing_action == Fail) {
    if (iVar2 < iVar1) {
      dVar8 = *xmin;
      dVar12 = *xmax;
      do {
        dVar9 = (double)Xc[lVar5];
        dVar3 = dVar9;
        if (dVar8 <= dVar9) {
          dVar3 = dVar8;
        }
        if (dVar9 <= dVar12) {
          dVar9 = dVar12;
        }
        lVar5 = lVar5 + 1;
        dVar8 = dVar3;
        dVar12 = dVar9;
      } while (lVar6 != lVar5);
      *xmin = dVar3;
      *xmax = dVar9;
    }
  }
  else if (iVar2 < iVar1) {
    uVar10 = SUB84(*xmax,0);
    uVar11 = (undefined4)((ulong)*xmax >> 0x20);
    dVar8 = *xmin;
    do {
      if (ABS(Xc[lVar5]) != INFINITY) {
        dVar12 = (double)Xc[lVar5];
        dVar3 = dVar12;
        if (dVar8 <= dVar12) {
          dVar3 = dVar8;
        }
        dVar8 = (double)(~-(ulong)NAN(dVar8) & (ulong)dVar3 | -(ulong)NAN(dVar8) & (ulong)dVar12);
        *xmin = dVar8;
        uVar7 = -(ulong)(NAN((double)CONCAT44(uVar11,uVar10)) ||
                        NAN((double)CONCAT44(uVar11,uVar10)));
        uVar13 = uVar7 & (ulong)dVar12;
        if (dVar12 <= (double)CONCAT44(uVar11,uVar10)) {
          dVar12 = (double)CONCAT44(uVar11,uVar10);
        }
        dVar12 = (double)(~uVar7 & (ulong)dVar12 | uVar13);
        *xmax = dVar12;
        uVar10 = SUB84(dVar12,0);
        uVar11 = (undefined4)((ulong)dVar12 >> 0x20);
      }
      lVar5 = lVar5 + 1;
    } while (lVar6 != lVar5);
  }
  dVar8 = *xmin;
  dVar12 = *xmax;
  bVar4 = true;
  if (((dVar8 != dVar12) || (NAN(dVar8) || NAN(dVar12))) &&
     (dVar8 != INFINITY || dVar12 != -INFINITY)) {
    bVar4 = NAN(dVar12);
  }
  *unsplittable = bVar4;
  return;
}

Assistant:

void get_range(size_t col_num, size_t nrows,
               real_t *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
               MissingAction missing_action, double &restrict xmin, double &restrict xmax, bool &unsplittable) noexcept
{
    xmin =  HUGE_VAL;
    xmax = -HUGE_VAL;

    if ((size_t)(Xc_indptr[col_num+1] - Xc_indptr[col_num]) < nrows)
    {
        xmin = 0;
        xmax = 0;
    }

    if (missing_action == Fail)
    {
        for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num+1]; ix++)
        {
            xmin = (Xc[ix] < xmin)? Xc[ix] : xmin;
            xmax = (Xc[ix] > xmax)? Xc[ix] : xmax;
        }
    }

    else
    {
        for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num+1]; ix++)
        {
            if (unlikely(std::isinf(Xc[ix]))) continue;
            xmin = std::fmin(xmin, Xc[ix]);
            xmax = std::fmax(xmax, Xc[ix]);
        }
    }

    unsplittable = (xmin == xmax) || (xmin == HUGE_VAL && xmax == -HUGE_VAL) || std::isnan(xmin) || std::isnan(xmax);
}